

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O0

CTcSrcFile * CTcSrcFile::open_ascii(char *filename)

{
  FILE *pFVar1;
  CCharmapToUni *mapper;
  char *in_RDI;
  osfildef *fp;
  osfildef *in_stack_ffffffffffffffd8;
  CTcSrcFile *in_stack_ffffffffffffffe0;
  CTcSrcFile *local_8;
  
  pFVar1 = fopen(in_RDI,"rb");
  if (pFVar1 == (FILE *)0x0) {
    local_8 = (CTcSrcFile *)0x0;
  }
  else {
    local_8 = (CTcSrcFile *)operator_new(0x430);
    mapper = (CCharmapToUni *)operator_new(0x210);
    memset(mapper,0,0x210);
    CCharmapToUniASCII::CCharmapToUniASCII((CCharmapToUniASCII *)local_8);
    CTcSrcFile(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,mapper);
  }
  return local_8;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_ascii(const char *filename)
{
    osfildef *fp;

    /* 
     *   open the file in binary mode, since we do all of the newline
     *   interpretation explicitly 
     */
    if ((fp = osfoprb(filename, OSFTTEXT)) == 0)
        return 0;

    /* return a source reader with a plain ASCII mapper */
    return new CTcSrcFile(fp, new CCharmapToUniASCII());
}